

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
pstore::broker::command_processor::echo
          (command_processor *this,fifo_path *param_1,broker_command *c)

{
  undefined8 uVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  broker_command *c_local;
  fifo_path *param_1_local;
  command_processor *this_local;
  
  lock._M_device = (mutex_type *)c;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)iomut);
  uVar1 = std::__cxx11::string::c_str();
  printf("ECHO:%s\n",uVar1);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void command_processor::echo (brokerface::fifo_path const &, broker_command const & c) {
            std::lock_guard<decltype (iomut)> lock{iomut};
            std::printf ("ECHO:%s\n", c.path.c_str ());
        }